

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O1

string * __thiscall
SchemeBool::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemeBool *this)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar2 = "#f";
  bVar3 = this->value != false;
  if (bVar3) {
    pcVar2 = "#t";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = "#f";
  if (bVar3) {
    pcVar1 = "#t";
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar1 + 2);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeBool::external_repr() const
{
    return value ? "#t" : "#f";
}